

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::InstanceSymbol::InstanceSymbol
          (InstanceSymbol *this,Compilation *compilation,string_view name,SourceLocation loc,
          DefinitionSymbol *definition,ParameterBuilder *paramBuilder,
          bitmask<slang::ast::InstanceFlags> flags)

{
  string_view name_00;
  SourceLocation in_RCX;
  InstanceSymbol *in_RDX;
  char *in_RSI;
  InstanceBodySymbol *in_R8;
  size_t in_R9;
  ParameterBuilder *in_stack_00000220;
  DefinitionSymbol *in_stack_00000228;
  Compilation *in_stack_00000230;
  bitmask<slang::ast::InstanceFlags> in_stack_0000023f;
  SourceLocation in_stack_00000240;
  
  InstanceBodySymbol::fromDefinition
            (in_stack_00000230,in_stack_00000228,in_stack_00000240,in_stack_00000220,
             in_stack_0000023f);
  name_00._M_str = in_RSI;
  name_00._M_len = in_R9;
  InstanceSymbol(in_RDX,name_00,in_RCX,in_R8);
  return;
}

Assistant:

InstanceSymbol::InstanceSymbol(Compilation& compilation, std::string_view name, SourceLocation loc,
                               const DefinitionSymbol& definition, ParameterBuilder& paramBuilder,
                               bitmask<InstanceFlags> flags) :
    InstanceSymbol(name, loc,
                   InstanceBodySymbol::fromDefinition(compilation, definition, loc, paramBuilder,
                                                      flags)) {
}